

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSwap
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  long __tmp;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ =
       (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = iVar2;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(&local_51,other_00);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar6 = (this->path_).current_size_;
  iVar7 = (this->path_).total_size_;
  pvVar3 = (this->path_).arena_or_elements_;
  iVar5 = (other->path_).total_size_;
  pvVar4 = (other->path_).arena_or_elements_;
  (this->path_).current_size_ = (other->path_).current_size_;
  (this->path_).total_size_ = iVar5;
  (this->path_).arena_or_elements_ = pvVar4;
  (other->path_).current_size_ = iVar6;
  (other->path_).total_size_ = iVar7;
  (other->path_).arena_or_elements_ = pvVar3;
  pvVar3 = (other->source_file_).tagged_ptr_.ptr_;
  (other->source_file_).tagged_ptr_.ptr_ = (this->source_file_).tagged_ptr_.ptr_;
  (this->source_file_).tagged_ptr_.ptr_ = pvVar3;
  iVar9 = this->begin_;
  iVar10 = this->end_;
  iVar8 = other->end_;
  this->begin_ = other->begin_;
  this->end_ = iVar8;
  other->begin_ = iVar9;
  other->end_ = iVar10;
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::InternalSwap(GeneratedCodeInfo_Annotation* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &source_file_, lhs_arena,
      &other->source_file_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(GeneratedCodeInfo_Annotation, end_)
      + sizeof(GeneratedCodeInfo_Annotation::end_)
      - PROTOBUF_FIELD_OFFSET(GeneratedCodeInfo_Annotation, begin_)>(
          reinterpret_cast<char*>(&begin_),
          reinterpret_cast<char*>(&other->begin_));
}